

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::find<kj::StringPtr,char_const(&)[4]>
          (TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *this,
          ArrayPtr<kj::StringPtr> table,char (*params) [7])

{
  uint uVar1;
  StringCompare *this_00;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  char *in_R8;
  char *pcVar7;
  StringPtr a;
  StringPtr b;
  Maybe<unsigned_long> MVar8;
  Iterator iter;
  Iterator IStack_68;
  size_t local_50;
  char (*local_48) [7];
  SearchKey local_40;
  StringPtr *local_38;
  size_t *local_30;
  
  local_50 = table.size_;
  local_38 = table.ptr;
  local_30 = &local_50;
  local_40._vptr_SearchKey = (_func_char_7_ **)&PTR_search_0021b8f8;
  pcVar7 = in_R8;
  local_48 = params;
  _::BTreeImpl::search(&IStack_68,(BTreeImpl *)&(local_38->content).size_,&local_40);
  aVar6 = extraout_RDX;
  if (((ulong)IStack_68.row != 0xe) && (uVar1 = (IStack_68.leaf)->rows[IStack_68.row].i, uVar1 != 0)
     ) {
    lVar4 = (ulong)(uVar1 - 1) * 0x10;
    this_00 = *(StringCompare **)(local_50 + lVar4);
    pcVar2 = *(char **)(local_50 + 8 + lVar4);
    sVar5 = strlen(in_R8);
    a.content.size_ = (size_t)in_R8;
    a.content.ptr = pcVar2;
    b.content.size_ = (size_t)pcVar7;
    b.content.ptr = (char *)(sVar5 + 1);
    bVar3 = _::anon_unknown_0::StringCompare::matches(this_00,a,b);
    aVar6 = extraout_RDX_00;
    if (bVar3) {
      uVar1 = (IStack_68.leaf)->rows[IStack_68.row].i;
      *this = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x1;
      *(ulong *)(this + 8) = (ulong)(uVar1 - 1);
      goto LAB_0015ad3b;
    }
  }
  *this = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x0;
LAB_0015ad3b:
  MVar8.ptr.field_1.value = aVar6.value;
  MVar8.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar8.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    auto iter = impl.search(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return size_t(*iter);
    } else {
      return kj::none;
    }
  }